

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

Maybe<capnp::compiler::NodeTranslator::BrandedDecl> * __thiscall
capnp::compiler::NodeTranslator::BrandScope::compileDeclExpression
          (Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *__return_storage_ptr__,
          BrandScope *this,Reader source,Resolver *resolver,ImplicitParams implicitMethodParams)

{
  ErrorReporter *pEVar1;
  Reader source_00;
  Reader subSource;
  Reader source_01;
  Reader source_02;
  Reader source_03;
  Reader source_04;
  Reader source_05;
  Reader subSource_00;
  ImplicitParams implicitMethodParams_00;
  ImplicitParams implicitMethodParams_01;
  ImplicitParams implicitMethodParams_02;
  Reader name_00;
  bool bVar2;
  bool bVar3;
  Reader *params_1;
  ElementCount index;
  char *pcVar4;
  ulong uVar5;
  BrandedDecl *t;
  ulong uVar6;
  StringPtr message;
  StringPtr message_00;
  StringPtr message_01;
  StringPtr message_02;
  StringPtr message_03;
  StringPtr SVar7;
  Reader RVar8;
  undefined8 local_450;
  ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl> compiledParams;
  Reader member;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> decl;
  IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
  local_340;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> memberDecl;
  Reader param;
  Reader name;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> result;
  Reader name_2;
  ResolvedDecl local_158;
  Reader local_f0;
  Reader local_c0;
  Reader local_90;
  Reader local_60;
  
  if (source._reader.dataSize < 0x10) goto switchD_0017c3c5_caseD_0;
  member._reader._32_8_ = source._reader._32_8_;
  switch(*source._reader.data) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 6:
  case 7:
  case 8:
  case 0xd:
    message.content.size_ = 0xf;
    message.content.ptr = "Expected name.";
    ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
              (this->errorReporter,&source,message);
  case 0:
switchD_0017c3c5_caseD_0:
    (__return_storage_ptr__->ptr).isSet = false;
    break;
  case 5:
    Expression::Reader::getRelativeName(&name_2,&source);
    RVar8 = LocatedText::Reader::getValue(&name_2);
    member._reader.segment = RVar8.super_StringPtr.content.ptr;
    member._reader.capTable = RVar8.super_StringPtr.content.size_;
    uVar5 = (ulong)implicitMethodParams.params.reader.elementCount;
    uVar6 = 0;
    do {
      if (uVar5 == uVar6) {
        params_1 = (Reader *)member._reader.capTable;
        (**resolver->_vptr_Resolver)(&decl,resolver,member._reader.segment);
        kj::_::
        NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
        ::NullableValue((NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                         *)&memberDecl,
                        (NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                         *)&decl);
        if (memberDecl.isSet == true) {
          source_05._reader.pointerCount = source._reader.pointerCount;
          source_05._reader._38_2_ = source._reader._38_2_;
          source_05._reader.dataSize = source._reader.dataSize;
          source_05._reader.capTable = source._reader.capTable;
          source_05._reader.segment = source._reader.segment;
          source_05._reader.data = source._reader.data;
          source_05._reader.pointers = source._reader.pointers;
          source_05._reader.nestingLimit = source._reader.nestingLimit;
          source_05._reader._44_4_ = source._reader._44_4_;
          interpretResolve((BrandedDecl *)&decl,this,resolver,&memberDecl.field_1.value.body,
                           source_05);
          kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
                    (&__return_storage_ptr__->ptr,(BrandedDecl *)&decl);
          BrandedDecl::~BrandedDecl((BrandedDecl *)&decl);
          return __return_storage_ptr__;
        }
        pEVar1 = this->errorReporter;
        kj::str<char_const(&)[14],capnp::Text::Reader&>
                  ((String *)&decl,(kj *)"Not defined: ",(char (*) [14])&member,params_1);
        if (decl.field_1._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (char *)CONCAT44(decl._4_4_,decl._0_4_);
        }
        message_02.content.size_ = decl.field_1._0_8_ + (ulong)(decl.field_1._0_8_ == 0);
        message_02.content.ptr = pcVar4;
        ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>(pEVar1,&name_2,message_02);
        kj::Array<char>::~Array((Array<char> *)&decl);
        goto switchD_0017c3c5_caseD_0;
      }
      index = (ElementCount)uVar6;
      _::ListReader::getStructElement
                ((StructReader *)&decl,&implicitMethodParams.params.reader,index);
      memberDecl._0_16_ = Declaration::BrandParameter::Reader::getName((Reader *)&decl);
      bVar3 = kj::StringPtr::operator==((StringPtr *)&memberDecl,(StringPtr *)&member);
      uVar6 = uVar6 + 1;
    } while (!bVar3);
    if (implicitMethodParams.scopeId == 0) {
      decl.field_1.value.source._reader.capTable = (CapTableReader *)0x0;
      decl.field_1.value.source._reader.data = (void *)0x0;
      decl.field_1.value.brand.ptr = (BrandScope *)0x0;
      decl.field_1.value.source._reader.segment = (SegmentReader *)0x0;
      decl.field_1._96_8_ = 0;
      decl.field_1.value.brand.disposer = (Disposer *)0x0;
      decl.field_1.value.source._reader.pointers = (WirePointer *)0x0;
      decl.field_1._152_8_ = 0x7fffffff;
      decl.field_1._0_8_ = 0;
      decl.isSet = true;
      decl._1_3_ = 0;
      decl.field_1._8_4_ = index;
      kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
                (&__return_storage_ptr__->ptr,(BrandedDecl *)&decl);
    }
    else {
      decl.field_1._8_4_ = index & 0xffff;
      decl.field_1.value.source._reader.capTable = (CapTableReader *)0x0;
      decl.field_1.value.source._reader.data = (void *)0x0;
      decl.field_1.value.brand.ptr = (BrandScope *)0x0;
      decl.field_1.value.source._reader.segment = (SegmentReader *)0x0;
      decl.field_1._96_8_ = 0;
      decl.field_1.value.brand.disposer = (Disposer *)0x0;
      decl.field_1.value.source._reader.pointers = (WirePointer *)0x0;
      decl.field_1._152_8_ = 0x7fffffff;
      decl.field_1._0_8_ = implicitMethodParams.scopeId;
      decl.isSet = true;
      decl._1_3_ = 0;
      kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
                (&__return_storage_ptr__->ptr,(BrandedDecl *)&decl);
    }
    BrandedDecl::~BrandedDecl((BrandedDecl *)&decl);
    break;
  case 9:
    member._reader.nestingLimit = source._reader.nestingLimit;
    member._reader._44_4_ = source._reader._44_4_;
    member._reader.data = source._reader.data;
    member._reader.pointers = source._reader.pointers;
    member._reader.segment = source._reader.segment;
    member._reader.capTable = source._reader.capTable;
    Expression::Application::Reader::getFunction(&local_60,(Reader *)&member);
    implicitMethodParams_01.params.reader.step = implicitMethodParams.params.reader.step;
    implicitMethodParams_01.params.reader.elementCount =
         implicitMethodParams.params.reader.elementCount;
    source_03._reader.capTable = local_60._reader.capTable;
    source_03._reader.segment = local_60._reader.segment;
    source_03._reader.data = local_60._reader.data;
    source_03._reader.pointers = local_60._reader.pointers;
    source_03._reader.dataSize = local_60._reader.dataSize;
    source_03._reader.pointerCount = local_60._reader.pointerCount;
    source_03._reader._38_2_ = local_60._reader._38_2_;
    source_03._reader.nestingLimit = local_60._reader.nestingLimit;
    source_03._reader._44_4_ = local_60._reader._44_4_;
    implicitMethodParams_01.params.reader.segment = implicitMethodParams.params.reader.segment;
    implicitMethodParams_01.scopeId = implicitMethodParams.scopeId;
    implicitMethodParams_01.params.reader.capTable = implicitMethodParams.params.reader.capTable;
    implicitMethodParams_01.params.reader.ptr = implicitMethodParams.params.reader.ptr;
    implicitMethodParams_01.params.reader.structDataSize =
         implicitMethodParams.params.reader.structDataSize;
    implicitMethodParams_01.params.reader.structPointerCount =
         implicitMethodParams.params.reader.structPointerCount;
    implicitMethodParams_01.params.reader.elementSize =
         implicitMethodParams.params.reader.elementSize;
    implicitMethodParams_01.params.reader._39_1_ = implicitMethodParams.params.reader._39_1_;
    implicitMethodParams_01.params.reader.nestingLimit =
         implicitMethodParams.params.reader.nestingLimit;
    implicitMethodParams_01.params.reader._44_4_ = implicitMethodParams.params.reader._44_4_;
    compileDeclExpression
              ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)&memberDecl,this,source_03,
               resolver,implicitMethodParams_01);
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
              (&decl,&memberDecl);
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue(&memberDecl);
    if (decl.isSet == true) {
      Expression::Application::Reader::getParams((Reader *)&name,(Reader *)&member);
      uVar5 = (ulong)(uint)name._reader.pointers;
      compiledParams.ptr =
           kj::_::HeapArrayDisposer::
           allocateUninitialized<capnp::compiler::NodeTranslator::BrandedDecl>(uVar5);
      compiledParams.endPtr = compiledParams.ptr + uVar5;
      compiledParams.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      bVar3 = false;
      compiledParams.pos = compiledParams.ptr;
      local_340.container = (Reader *)&name;
      for (local_340.index = 0; local_340.index != (uint)name._reader.pointers;
          local_340.index = local_340.index + 1) {
        _::
        IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
        ::operator*(&param,&local_340);
        if ((0xf < param._reader.dataSize) && (*param._reader.data == 1)) {
          pEVar1 = this->errorReporter;
          Expression::Param::Reader::getNamed((Reader *)&memberDecl,&param);
          message_00.content.size_ = 0x22;
          message_00.content.ptr = "Named parameter not allowed here.";
          ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader>
                    (pEVar1,(Reader *)&memberDecl,message_00);
        }
        Expression::Param::Reader::getValue(&local_c0,&param);
        implicitMethodParams_02.params.reader.step = implicitMethodParams.params.reader.step;
        implicitMethodParams_02.params.reader.elementCount =
             implicitMethodParams.params.reader.elementCount;
        source_04._reader.capTable = local_c0._reader.capTable;
        source_04._reader.segment = local_c0._reader.segment;
        source_04._reader.data = local_c0._reader.data;
        source_04._reader.pointers = local_c0._reader.pointers;
        source_04._reader.dataSize = local_c0._reader.dataSize;
        source_04._reader.pointerCount = local_c0._reader.pointerCount;
        source_04._reader._38_2_ = local_c0._reader._38_2_;
        source_04._reader.nestingLimit = local_c0._reader.nestingLimit;
        source_04._reader._44_4_ = local_c0._reader._44_4_;
        implicitMethodParams_02.params.reader.segment = implicitMethodParams.params.reader.segment;
        implicitMethodParams_02.scopeId = implicitMethodParams.scopeId;
        implicitMethodParams_02.params.reader.capTable = implicitMethodParams.params.reader.capTable
        ;
        implicitMethodParams_02.params.reader.ptr = implicitMethodParams.params.reader.ptr;
        implicitMethodParams_02.params.reader.structDataSize =
             implicitMethodParams.params.reader.structDataSize;
        implicitMethodParams_02.params.reader.structPointerCount =
             implicitMethodParams.params.reader.structPointerCount;
        implicitMethodParams_02.params.reader.elementSize =
             implicitMethodParams.params.reader.elementSize;
        implicitMethodParams_02.params.reader._39_1_ = implicitMethodParams.params.reader._39_1_;
        implicitMethodParams_02.params.reader.nestingLimit =
             implicitMethodParams.params.reader.nestingLimit;
        implicitMethodParams_02.params.reader._44_4_ = implicitMethodParams.params.reader._44_4_;
        compileDeclExpression
                  ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)&name_2,this,source_04,
                   resolver,implicitMethodParams_02);
        kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
                  (&memberDecl,
                   (NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)&name_2);
        kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
                  ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)&name_2);
        bVar2 = true;
        if (memberDecl.isSet == true) {
          BrandedDecl::BrandedDecl(compiledParams.pos,&memberDecl.field_1.value);
          compiledParams.pos = compiledParams.pos + 1;
          bVar2 = bVar3;
        }
        bVar3 = bVar2;
        kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
                  (&memberDecl);
      }
      if (bVar3) {
        kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
                  (&__return_storage_ptr__->ptr,&decl.field_1.value);
      }
      else {
        result.size_ = ((long)compiledParams.pos - (long)compiledParams.ptr) / 0xa8;
        result.ptr = compiledParams.ptr;
        result.disposer = compiledParams.disposer;
        compiledParams.ptr = (BrandedDecl *)0x0;
        compiledParams.pos = (RemoveConst<capnp::compiler::NodeTranslator::BrandedDecl> *)0x0;
        compiledParams.endPtr = (BrandedDecl *)0x0;
        subSource_00._reader.pointerCount = source._reader.pointerCount;
        subSource_00._reader._38_2_ = source._reader._38_2_;
        subSource_00._reader.dataSize = source._reader.dataSize;
        subSource_00._reader.capTable = source._reader.capTable;
        subSource_00._reader.segment = source._reader.segment;
        subSource_00._reader.data = source._reader.data;
        subSource_00._reader.pointers = source._reader.pointers;
        subSource_00._reader.nestingLimit = source._reader.nestingLimit;
        subSource_00._reader._44_4_ = source._reader._44_4_;
        BrandedDecl::applyParams
                  ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)&name_2,
                   &decl.field_1.value,&result,subSource_00);
        kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
                  (&memberDecl,
                   (NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)&name_2);
        kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
                  ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)&name_2);
        kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::~Array(&result);
        t = (BrandedDecl *)&decl.field_1;
        if (memberDecl.isSet != false) {
          t = (BrandedDecl *)&memberDecl.field_1;
        }
        kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
                  (&__return_storage_ptr__->ptr,t);
        kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
                  (&memberDecl);
      }
      kj::ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl>::dispose(&compiledParams);
    }
    else {
LAB_0017cb68:
      (__return_storage_ptr__->ptr).isSet = false;
    }
    goto LAB_0017d01b;
  case 10:
    member._reader.nestingLimit = source._reader.nestingLimit;
    member._reader._44_4_ = source._reader._44_4_;
    member._reader.data = source._reader.data;
    member._reader.pointers = source._reader.pointers;
    member._reader.segment = source._reader.segment;
    member._reader.capTable = source._reader.capTable;
    Expression::Member::Reader::getParent(&local_90,&member);
    implicitMethodParams_00.params.reader.step = implicitMethodParams.params.reader.step;
    implicitMethodParams_00.params.reader.elementCount =
         implicitMethodParams.params.reader.elementCount;
    source_00._reader.capTable = local_90._reader.capTable;
    source_00._reader.segment = local_90._reader.segment;
    source_00._reader.data = local_90._reader.data;
    source_00._reader.pointers = local_90._reader.pointers;
    source_00._reader.dataSize = local_90._reader.dataSize;
    source_00._reader.pointerCount = local_90._reader.pointerCount;
    source_00._reader._38_2_ = local_90._reader._38_2_;
    source_00._reader.nestingLimit = local_90._reader.nestingLimit;
    source_00._reader._44_4_ = local_90._reader._44_4_;
    implicitMethodParams_00.params.reader.segment = implicitMethodParams.params.reader.segment;
    implicitMethodParams_00.scopeId = implicitMethodParams.scopeId;
    implicitMethodParams_00.params.reader.capTable = implicitMethodParams.params.reader.capTable;
    implicitMethodParams_00.params.reader.ptr = implicitMethodParams.params.reader.ptr;
    implicitMethodParams_00.params.reader.structDataSize =
         implicitMethodParams.params.reader.structDataSize;
    implicitMethodParams_00.params.reader.structPointerCount =
         implicitMethodParams.params.reader.structPointerCount;
    implicitMethodParams_00.params.reader.elementSize =
         implicitMethodParams.params.reader.elementSize;
    implicitMethodParams_00.params.reader._39_1_ = implicitMethodParams.params.reader._39_1_;
    implicitMethodParams_00.params.reader.nestingLimit =
         implicitMethodParams.params.reader.nestingLimit;
    implicitMethodParams_00.params.reader._44_4_ = implicitMethodParams.params.reader._44_4_;
    compileDeclExpression
              ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)&memberDecl,this,source_00,
               resolver,implicitMethodParams_00);
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
              (&decl,&memberDecl);
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue(&memberDecl);
    if (decl.isSet != true) goto LAB_0017cb68;
    Expression::Member::Reader::getName(&name,&member);
    SVar7.content = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&name);
    subSource._reader.pointerCount = source._reader.pointerCount;
    subSource._reader._38_2_ = source._reader._38_2_;
    subSource._reader.dataSize = source._reader.dataSize;
    subSource._reader.capTable = source._reader.capTable;
    subSource._reader.segment = source._reader.segment;
    subSource._reader.data = source._reader.data;
    subSource._reader.pointers = source._reader.pointers;
    subSource._reader.nestingLimit = source._reader.nestingLimit;
    subSource._reader._44_4_ = source._reader._44_4_;
    BrandedDecl::getMember
              ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)&name_2,&decl.field_1.value,
               SVar7,subSource);
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
              (&memberDecl,(NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)&name_2);
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
              ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)&name_2);
    if (memberDecl.isSet == true) {
      kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
                (&__return_storage_ptr__->ptr,&memberDecl.field_1.value);
    }
    else {
      pEVar1 = this->errorReporter;
      Expression::Member::Reader::getParent(&local_f0,&member);
      name_00._reader.capTable = (CapTableReader *)compiledParams.ptr;
      name_00._reader.segment = (SegmentReader *)local_450;
      name_00._reader.data = compiledParams.pos;
      name_00._reader.pointers = (WirePointer *)compiledParams.endPtr;
      name_00._reader._32_8_ = compiledParams.disposer;
      name_00._reader._40_8_ = member._reader.segment;
      expressionString(name_00);
      RVar8 = LocatedText::Reader::getValue(&name);
      compiledParams.ptr = RVar8.super_StringPtr.content.ptr;
      compiledParams.pos = RVar8.super_StringPtr.content.size_;
      kj::str<char_const(&)[2],kj::String,char_const(&)[24],capnp::Text::Reader,char_const(&)[2]>
                ((String *)&name_2,(kj *)0x1dad29,(char (*) [2])&param,
                 (String *)"\' has no member named \'",(char (*) [24])&compiledParams,
                 (Reader *)0x1dad29,(char (*) [2])local_f0._reader.segment);
      if (name_2._reader.capTable == (CapTableReader *)0x0) {
        name_2._reader.segment = (SegmentReader *)0x1ebdf1;
      }
      else {
      }
      message_03.content.size_ =
           (long)&(name_2._reader.capTable)->_vptr_CapTableReader +
           (ulong)(name_2._reader.capTable == (CapTableReader *)0x0);
      message_03.content.ptr = (char *)name_2._reader.segment;
      ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>(pEVar1,&name,message_03);
      kj::Array<char>::~Array((Array<char> *)&name_2);
      kj::Array<char>::~Array((Array<char> *)&param);
      (__return_storage_ptr__->ptr).isSet = false;
    }
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue(&memberDecl);
LAB_0017d01b:
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue(&decl);
    break;
  case 0xb:
    Expression::Reader::getAbsoluteName((Reader *)&member,&source);
    (*resolver->_vptr_Resolver[5])(&name_2,resolver);
    RVar8 = LocatedText::Reader::getValue((Reader *)&member);
    (**(code **)(*(long *)name_2._reader._32_8_ + 8))
              (&decl,name_2._reader._32_8_,RVar8.super_StringPtr.content.ptr,
               RVar8.super_StringPtr.content.size_);
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::NullableValue((NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                     *)&memberDecl,
                    (NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                     *)&decl);
    if (memberDecl.isSet == true) {
      source_01._reader.pointerCount = source._reader.pointerCount;
      source_01._reader._38_2_ = source._reader._38_2_;
      source_01._reader.dataSize = source._reader.dataSize;
      source_01._reader.capTable = source._reader.capTable;
      source_01._reader.segment = source._reader.segment;
      source_01._reader.data = source._reader.data;
      source_01._reader.pointers = source._reader.pointers;
      source_01._reader.nestingLimit = source._reader.nestingLimit;
      source_01._reader._44_4_ = source._reader._44_4_;
      interpretResolve((BrandedDecl *)&decl,this,resolver,&memberDecl.field_1.value.body,source_01);
      kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
                (&__return_storage_ptr__->ptr,(BrandedDecl *)&decl);
      BrandedDecl::~BrandedDecl((BrandedDecl *)&decl);
    }
    else {
      pEVar1 = this->errorReporter;
      name_2._reader._0_16_ = LocatedText::Reader::getValue((Reader *)&member);
      kj::str<char_const(&)[14],capnp::Text::Reader>
                ((String *)&decl,(kj *)"Not defined: ",(char (*) [14])&name_2,(Reader *)&name_2);
      if (decl.field_1._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (char *)CONCAT44(decl._4_4_,decl._0_4_);
      }
      message_01.content.size_ = decl.field_1._0_8_ + (ulong)(decl.field_1._0_8_ == 0);
      message_01.content.ptr = pcVar4;
      ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                (pEVar1,(Reader *)&member,message_01);
      kj::Array<char>::~Array((Array<char> *)&decl);
      (__return_storage_ptr__->ptr).isSet = false;
    }
    break;
  case 0xc:
    Expression::Reader::getImport(&name_2,&source);
    RVar8 = LocatedText::Reader::getValue(&name_2);
    (*resolver->_vptr_Resolver[8])
              (&decl,resolver,RVar8.super_StringPtr.content.ptr,RVar8.super_StringPtr.content.size_)
    ;
    memberDecl.isSet = decl.isSet;
    if (decl.isSet == true) {
      memberDecl.field_1._32_8_ = decl.field_1._32_8_;
      memberDecl.field_1._16_8_ = decl.field_1._16_8_;
      memberDecl.field_1._24_8_ = decl.field_1._24_8_;
      memberDecl.field_1._0_8_ = decl.field_1._0_8_;
      memberDecl.field_1._40_1_ = decl.field_1._40_1_;
      if (decl.field_1._40_1_ == '\x01') {
        memberDecl.field_1._80_8_ = decl.field_1._80_8_;
        memberDecl.field_1._88_8_ = decl.field_1._88_8_;
        memberDecl.field_1._64_8_ = decl.field_1._64_8_;
        memberDecl.field_1._72_8_ = decl.field_1._72_8_;
        memberDecl.field_1._48_8_ = decl.field_1._48_8_;
        memberDecl.field_1._56_8_ = decl.field_1._56_8_;
      }
      local_158.id = decl.field_1._0_8_;
      local_158.scopeId = decl.field_1._16_8_;
      local_158._24_8_ = decl.field_1._24_8_;
      local_158.resolver = (Resolver *)decl.field_1._32_8_;
      local_158.brand.ptr.isSet = (bool)decl.field_1._40_1_;
      if (decl.field_1._40_1_ == '\x01') {
        local_158.brand.ptr.field_1._32_8_ = memberDecl.field_1._80_8_;
        local_158.brand.ptr.field_1._40_8_ = memberDecl.field_1._88_8_;
        local_158.brand.ptr.field_1.value._reader.data = (void *)memberDecl.field_1._64_8_;
        local_158.brand.ptr.field_1.value._reader.pointers =
             (WirePointer *)memberDecl.field_1._72_8_;
        local_158.brand.ptr.field_1.value._reader.segment =
             (SegmentReader *)memberDecl.field_1._48_8_;
        local_158.brand.ptr.field_1.value._reader.capTable =
             (CapTableReader *)memberDecl.field_1._56_8_;
      }
      kj::
      refcounted<capnp::compiler::NodeTranslator::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long&,unsigned_int&,capnp::compiler::NodeTranslator::Resolver&>
                ((kj *)&member,this->errorReporter,(unsigned_long *)&memberDecl.field_1,
                 (uint *)((long)&memberDecl.field_1 + 8),(Resolver *)decl.field_1._32_8_);
      source_02._reader.pointerCount = source._reader.pointerCount;
      source_02._reader._38_2_ = source._reader._38_2_;
      source_02._reader.dataSize = source._reader.dataSize;
      source_02._reader.capTable = source._reader.capTable;
      source_02._reader.segment = source._reader.segment;
      source_02._reader.data = source._reader.data;
      source_02._reader.pointers = source._reader.pointers;
      source_02._reader.nestingLimit = source._reader.nestingLimit;
      source_02._reader._44_4_ = source._reader._44_4_;
      BrandedDecl::BrandedDecl
                ((BrandedDecl *)&decl,&local_158,
                 (Own<capnp::compiler::NodeTranslator::BrandScope> *)&member,source_02);
      kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
                (&__return_storage_ptr__->ptr,(BrandedDecl *)&decl);
      BrandedDecl::~BrandedDecl((BrandedDecl *)&decl);
      kj::Own<capnp::compiler::NodeTranslator::BrandScope>::dispose
                ((Own<capnp::compiler::NodeTranslator::BrandScope> *)&member);
    }
    else {
      pEVar1 = this->errorReporter;
      RVar8 = LocatedText::Reader::getValue(&name_2);
      member._reader.segment = RVar8.super_StringPtr.content.ptr;
      member._reader.capTable = RVar8.super_StringPtr.content.size_;
      kj::str<char_const(&)[16],capnp::Text::Reader>
                ((String *)&decl,(kj *)"Import failed: ",(char (*) [16])&member,(Reader *)&member);
      if (decl.field_1._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (char *)CONCAT44(decl._4_4_,decl._0_4_);
      }
      SVar7.content.size_ = decl.field_1._0_8_ + (ulong)(decl.field_1._0_8_ == 0);
      SVar7.content.ptr = pcVar4;
      ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>(pEVar1,&name_2,SVar7);
      kj::Array<char>::~Array((Array<char> *)&decl);
      (__return_storage_ptr__->ptr).isSet = false;
    }
    break;
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::BrandedDecl> NodeTranslator::BrandScope::compileDeclExpression(
    Expression::Reader source, Resolver& resolver,
    ImplicitParams implicitMethodParams) {
  switch (source.which()) {
    case Expression::UNKNOWN:
      // Error reported earlier.
      return nullptr;

    case Expression::POSITIVE_INT:
    case Expression::NEGATIVE_INT:
    case Expression::FLOAT:
    case Expression::STRING:
    case Expression::BINARY:
    case Expression::LIST:
    case Expression::TUPLE:
    case Expression::EMBED:
      errorReporter.addErrorOn(source, "Expected name.");
      return nullptr;

    case Expression::RELATIVE_NAME: {
      auto name = source.getRelativeName();
      auto nameValue = name.getValue();

      // Check implicit method params first.
      for (auto i: kj::indices(implicitMethodParams.params)) {
        if (implicitMethodParams.params[i].getName() == nameValue) {
          if (implicitMethodParams.scopeId == 0) {
            return BrandedDecl::implicitMethodParam(i);
          } else {
            return BrandedDecl(Resolver::ResolvedParameter {
                implicitMethodParams.scopeId, static_cast<uint16_t>(i) },
                Expression::Reader());
          }
        }
      }

      KJ_IF_MAYBE(r, resolver.resolve(nameValue)) {
        return interpretResolve(resolver, *r, source);
      } else {
        errorReporter.addErrorOn(name, kj::str("Not defined: ", nameValue));
        return nullptr;
      }
    }

    case Expression::ABSOLUTE_NAME: {
      auto name = source.getAbsoluteName();
      KJ_IF_MAYBE(r, resolver.getTopScope().resolver->resolveMember(name.getValue())) {
        return interpretResolve(resolver, *r, source);
      } else {
        errorReporter.addErrorOn(name, kj::str("Not defined: ", name.getValue()));
        return nullptr;
      }
    }